

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

int __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::FindKey
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *C)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  Addr *pAVar6;
  pointer pAVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&D,this->N);
  if ((this->RootAddr).FileOff == -1) {
    iVar3 = -1;
  }
  else {
    FindNode(this,this->RootAddr,C);
LAB_0012b99a:
    if (C->NodeState != '1') {
      lVar9 = 0;
      lVar8 = 0;
      lVar10 = 0;
      lVar5 = 0;
      while( true ) {
        uVar4 = (long)this->N - 1;
        if (((long)uVar4 <= lVar5) ||
           ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5] != '1')) goto LAB_0012b9f2;
        bVar1 = std::operator>(k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&(((C->k).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar9));
        if (!bVar1) break;
        lVar5 = lVar5 + 1;
        lVar10 = lVar10 + -8;
        lVar8 = lVar8 + -0x20;
        lVar9 = lVar9 + 0x20;
      }
      uVar4 = (ulong)(this->N - 1);
LAB_0012b9f2:
      if (((int)uVar4 != (int)lVar5) &&
         ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar5] != '0')) {
        _Var2 = std::operator==(k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)(C->k).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start - lVar8));
        if (!_Var2) goto LAB_0012baa3;
        FindNode(this,(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5],&D);
        IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::IndexNode(&local_90,&D);
        std::__cxx11::string::string((string *)&local_b0,(string *)k);
        iVar3 = HaveK(this,&local_90,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~IndexNode(&local_90);
        pAVar7 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start + (iVar3 == 0);
        goto LAB_0012bac1;
      }
      pAVar6 = (Addr *)((long)(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start - lVar10);
      goto LAB_0012ba0a;
    }
    lVar8 = 0;
    lVar5 = 0;
    while( true ) {
      uVar4 = (long)this->N - 1;
      if (((long)uVar4 <= lVar5) ||
         ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar5] != '1')) goto LAB_0012bb0e;
      bVar1 = std::operator!=(k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(((C->k).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar8));
      if (!bVar1) break;
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0x20;
    }
    uVar4 = (ulong)(this->N - 1);
LAB_0012bb0e:
    iVar3 = -1;
    if (((int)uVar4 != (int)lVar5) &&
       ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar5] != '0')) {
      iVar3 = (int)lVar5;
    }
  }
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&D);
  return iVar3;
LAB_0012baa3:
  bVar1 = std::operator<(k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)(C->k).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - lVar8));
  if (bVar1) {
    pAVar7 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
             _M_start;
LAB_0012bac1:
    pAVar6 = (Addr *)((long)pAVar7 - lVar10);
LAB_0012ba0a:
    FindNode(this,*pAVar6,C);
  }
  goto LAB_0012b99a;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}